

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_pathinfo(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  jx9_value *pArray_00;
  jx9_value *pVal;
  jx9_value *pValue;
  jx9_value *pArray;
  int nComp;
  int iLen;
  SyString *pComp;
  path_info sInfo;
  char *zPath;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_string(pCtx,"",0);
  }
  else {
    sInfo.sFilename._8_8_ = jx9_value_to_string(*apArg,(int *)((long)&pArray + 4));
    if (pArray._4_4_ < 1) {
      jx9_result_string(pCtx,"",0);
    }
    else {
      ExtractPathInfo((char *)sInfo.sFilename._8_8_,pArray._4_4_,(path_info *)&pComp);
      if ((nArg < 2) || (iVar1 = jx9_value_is_int(apArg[1]), iVar1 == 0)) {
        pArray_00 = jx9_context_new_array(pCtx);
        pVal = jx9_context_new_scalar(pCtx);
        if ((pArray_00 == (jx9_value *)0x0) || (pVal == (jx9_value *)0x0)) {
          jx9_result_bool(pCtx,0);
        }
        else {
          _nComp = (uint *)&pComp;
          if ((int)sInfo.sDir.zString != 0) {
            jx9_value_string(pVal,(char *)pComp,(int)sInfo.sDir.zString);
            jx9_array_add_strkey_elem(pArray_00,"dirname",pVal);
          }
          jx9_value_reset_string_cursor(pVal);
          _nComp = &sInfo.sDir.nByte;
          if ((int)sInfo.sBasename.zString != 0) {
            jx9_value_string(pVal,(char *)sInfo.sDir._8_8_,(int)sInfo.sBasename.zString);
            jx9_array_add_strkey_elem(pArray_00,"basename",pVal);
          }
          jx9_value_reset_string_cursor(pVal);
          _nComp = &sInfo.sBasename.nByte;
          if ((int)sInfo.sExtension.zString != 0) {
            jx9_value_string(pVal,(char *)sInfo.sBasename._8_8_,(int)sInfo.sExtension.zString);
            jx9_array_add_strkey_elem(pArray_00,"extension",pVal);
          }
          jx9_value_reset_string_cursor(pVal);
          _nComp = &sInfo.sExtension.nByte;
          if ((int)sInfo.sFilename.zString != 0) {
            jx9_value_string(pVal,(char *)sInfo.sExtension._8_8_,(int)sInfo.sFilename.zString);
            jx9_array_add_strkey_elem(pArray_00,"filename",pVal);
          }
          jx9_result_value(pCtx,pArray_00);
        }
      }
      else {
        pArray._0_4_ = jx9_value_to_int(apArg[1]);
        switch((int)pArray) {
        case 1:
          _nComp = (uint *)&pComp;
          if ((int)sInfo.sDir.zString == 0) {
            jx9_result_string(pCtx,"",0);
          }
          else {
            jx9_result_string(pCtx,(char *)pComp,(int)sInfo.sDir.zString);
          }
          break;
        case 2:
          _nComp = &sInfo.sDir.nByte;
          if ((int)sInfo.sBasename.zString == 0) {
            jx9_result_string(pCtx,"",0);
          }
          else {
            jx9_result_string(pCtx,(char *)sInfo.sDir._8_8_,(int)sInfo.sBasename.zString);
          }
          break;
        case 3:
          _nComp = &sInfo.sBasename.nByte;
          if ((int)sInfo.sExtension.zString == 0) {
            jx9_result_string(pCtx,"",0);
          }
          else {
            jx9_result_string(pCtx,(char *)sInfo.sBasename._8_8_,(int)sInfo.sExtension.zString);
          }
          break;
        case 4:
          _nComp = &sInfo.sExtension.nByte;
          if ((int)sInfo.sFilename.zString == 0) {
            jx9_result_string(pCtx,"",0);
          }
          else {
            jx9_result_string(pCtx,(char *)sInfo.sExtension._8_8_,(int)sInfo.sFilename.zString);
          }
          break;
        default:
          jx9_result_string(pCtx,"",0);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_pathinfo(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath;
	path_info sInfo;
	SyString *pComp;
	int iLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Point to the target path */
	zPath = jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract path info */
	ExtractPathInfo(zPath, iLen, &sInfo);
	if( nArg > 1 && jx9_value_is_int(apArg[1]) ){
		/* Return path component */
		int nComp = jx9_value_to_int(apArg[1]);
		switch(nComp){
		case 1: /* PATHINFO_DIRNAME */
			pComp = &sInfo.sDir;
			if( pComp->nByte > 0 ){
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}else{
				/* Expand the empty string */
				jx9_result_string(pCtx, "", 0);
			}
			break;
		case 2: /*PATHINFO_BASENAME*/
			pComp = &sInfo.sBasename;
			if( pComp->nByte > 0 ){
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}else{
				/* Expand the empty string */
				jx9_result_string(pCtx, "", 0);
			}
			break;
		case 3: /*PATHINFO_EXTENSION*/
			pComp = &sInfo.sExtension;
			if( pComp->nByte > 0 ){
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}else{
				/* Expand the empty string */
				jx9_result_string(pCtx, "", 0);
			}
			break;
		case 4: /*PATHINFO_FILENAME*/
			pComp = &sInfo.sFilename;
			if( pComp->nByte > 0 ){
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}else{
				/* Expand the empty string */
				jx9_result_string(pCtx, "", 0);
			}
			break;
		default:
			/* Expand the empty string */
			jx9_result_string(pCtx, "", 0);
			break;
		}
	}else{
		/* Return an associative array */
		jx9_value *pArray, *pValue;
		pArray = jx9_context_new_array(pCtx);
		pValue = jx9_context_new_scalar(pCtx);
		if( pArray == 0 || pValue == 0 ){
			/* Out of mem, return NULL */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* dirname */
		pComp = &sInfo.sDir;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			/* Perform the insertion */
			jx9_array_add_strkey_elem(pArray, "dirname", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		/* basername */
		pComp = &sInfo.sBasename;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			/* Perform the insertion */
			jx9_array_add_strkey_elem(pArray, "basename", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		/* extension */
		pComp = &sInfo.sExtension;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			/* Perform the insertion */
			jx9_array_add_strkey_elem(pArray, "extension", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		/* filename */
		pComp = &sInfo.sFilename;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			/* Perform the insertion */
			jx9_array_add_strkey_elem(pArray, "filename", pValue); /* Will make it's own copy */
		}
		/* Return the created array */
		jx9_result_value(pCtx, pArray);
		/* Don't worry about freeing memory, everything will be released
		 * automatically as soon we return from this foreign function.
		 */
	}
	return JX9_OK;
}